

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Name> *
wasm::WATParser::maybeMemidx<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  optional<unsigned_int> oVar1;
  bool bVar2;
  uint *puVar3;
  Name *pNVar4;
  Result<wasm::Name> local_98;
  undefined1 local_70 [8];
  optional<wasm::Name> id;
  Result<wasm::Name> local_48;
  _Optional_payload_base<unsigned_int> local_20;
  optional<unsigned_int> x;
  ParseDefsCtx *ctx_local;
  
  x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)ctx;
  local_20 = (_Optional_payload_base<unsigned_int>)Lexer::takeU32(&ctx->in);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_20);
  oVar1 = x;
  if (bVar2) {
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_20);
    ParseDefsCtx::getMemoryFromIdx
              (&local_48,
               (ParseDefsCtx *)
               oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>,*puVar3);
    MaybeResult<wasm::Name>::MaybeResult<wasm::Name>(__return_storage_ptr__,&local_48);
    Result<wasm::Name>::~Result(&local_48);
  }
  else {
    Lexer::takeID((optional<wasm::Name> *)local_70,
                  (Lexer *)((long)x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int> + 8));
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_70);
    oVar1 = x;
    if (bVar2) {
      pNVar4 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_70);
      ParseDefsCtx::getMemoryFromName
                (&local_98,
                 (ParseDefsCtx *)
                 oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>,(Name)(pNVar4->super_IString).str);
      MaybeResult<wasm::Name>::MaybeResult<wasm::Name>(__return_storage_ptr__,&local_98);
      Result<wasm::Name>::~Result(&local_98);
    }
    else {
      MaybeResult<wasm::Name>::MaybeResult(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::MemoryIdxT> maybeMemidx(Ctx& ctx) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getMemoryFromIdx(*x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getMemoryFromName(*id);
  }
  return {};
}